

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::CopyFrom
          (EmbeddingNDLayerParams *this,EmbeddingNDLayerParams *from)

{
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void EmbeddingNDLayerParams::CopyFrom(const EmbeddingNDLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.EmbeddingNDLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}